

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_cfilter_add(Curl_easy *data,connectdata *conn,int sockindex)

{
  uint uVar1;
  CURLcode CVar2;
  Curl_cfilter *in_RAX;
  Curl_cfilter *cf;
  Curl_cfilter *local_28;
  
  uVar1._0_1_ = (data->state).httpwant;
  uVar1._1_1_ = (data->state).httpversion;
  uVar1._2_1_ = (data->state).httpreq;
  uVar1._3_1_ = (data->state).select_bits;
  local_28 = in_RAX;
  CVar2 = cf_ssl_create(&local_28,(Curl_easy *)(ulong)uVar1,(connectdata *)(ulong)(uint)conn->bits);
  if (CVar2 == CURLE_OK) {
    Curl_conn_cf_add(data,conn,sockindex,local_28);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_ssl_cfilter_add(struct Curl_easy *data,
                              struct connectdata *conn,
                              int sockindex)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_create(&cf, data, conn);
  if(!result)
    Curl_conn_cf_add(data, conn, sockindex, cf);
  return result;
}